

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArraySamplingTest::getShadowSamplingFunctionCall
          (TextureCubeMapArraySamplingTest *this,samplingFunction sampling_function,
          GLchar *color_type,GLuint n_components,GLchar *attribute_name_prefix,
          GLchar *attribute_index,GLchar *color_variable_name,GLchar *color_variable_index,
          GLchar *sampler_name_p,string *out_code)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  NotSupportedError *this_00;
  GLuint i;
  long lVar4;
  char *pcVar5;
  stringstream stream;
  var2str local_208;
  var2str local_1e8;
  stringstream local_1d0 [16];
  undefined1 local_1c0 [376];
  var2str local_48;
  
  std::__cxx11::stringstream::stringstream(local_1d0);
  switch(sampling_function) {
  case Texture:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"    ",4);
    local_208.m_prefix = (GLchar *)0x0;
    local_208.m_name = color_variable_name;
    local_208.m_index = color_variable_index;
    glcts::operator<<((ostream *)local_1c0,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"texture",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"(",1);
    if (sampler_name_p == (GLchar *)0x0) {
      std::ios::clear((int)(ostream *)local_1c0 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(sampler_name_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,sampler_name_p,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
    local_208.m_name = "texture_coordinates";
    local_208.m_prefix = attribute_name_prefix;
    local_208.m_index = attribute_index;
    glcts::operator<<((ostream *)local_1c0,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
    local_1e8.m_name = "refZ";
    local_1e8.m_prefix = attribute_name_prefix;
    local_1e8.m_index = attribute_index;
    glcts::operator<<((ostream *)local_1c0,&local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,");",2);
    std::ios::widen((char)*(_func_int **)(local_1c0._0_8_ + -0x18) + (char)(ostream *)local_1c0);
    break;
  case TextureLod:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"    ",4);
    local_208.m_prefix = (GLchar *)0x0;
    local_208.m_name = color_variable_name;
    local_208.m_index = color_variable_index;
    glcts::operator<<((ostream *)local_1c0,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," = ",3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"textureLod",10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"(",1);
    if (sampler_name_p == (GLchar *)0x0) {
      std::ios::clear((int)(ostream *)local_1c0 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18));
    }
    else {
      sVar3 = strlen(sampler_name_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,sampler_name_p,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
    local_208.m_name = "texture_coordinates";
    local_208.m_prefix = attribute_name_prefix;
    local_208.m_index = attribute_index;
    glcts::operator<<((ostream *)local_1c0,&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
    local_1e8.m_name = "lod";
    local_1e8.m_prefix = attribute_name_prefix;
    local_1e8.m_index = attribute_index;
    glcts::operator<<((ostream *)local_1c0,&local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
    local_48.m_name = "refZ";
    local_48.m_prefix = attribute_name_prefix;
    local_48.m_index = attribute_index;
    glcts::operator<<((ostream *)local_1c0,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,");",2);
    std::ios::widen((char)*(_func_int **)(local_1c0._0_8_ + -0x18) + (char)(ostream *)local_1c0);
    break;
  case TextureGrad:
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"textureGrad operation is not available for samplerCubeArrayShadow",
               fixed_sample_locations_values + 1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
               ,0xbfe);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  case TextureGather:
    iVar2 = (int)(ostream *)local_1c0;
    cVar1 = (char)(ostream *)local_1c0;
    if (n_components == 4) {
      lVar4 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"    ",4);
        if (color_type == (GLchar *)0x0) {
          std::ios::clear(iVar2 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18));
        }
        else {
          sVar3 = strlen(color_type);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,color_type,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"component_",10);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1c0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," = ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"textureGather",0xd)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"(",1);
        if (sampler_name_p == (GLchar *)0x0) {
          std::ios::clear(iVar2 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18));
        }
        else {
          sVar3 = strlen(sampler_name_p);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1c0,sampler_name_p,sVar3);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
        local_208.m_name = "texture_coordinates";
        local_208.m_prefix = attribute_name_prefix;
        local_208.m_index = attribute_index;
        glcts::operator<<((ostream *)local_1c0,&local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
        local_1e8.m_name = "refZ";
        local_1e8.m_prefix = attribute_name_prefix;
        local_1e8.m_index = attribute_index;
        glcts::operator<<((ostream *)local_1c0,&local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,");",2);
        std::ios::widen((char)*(_func_int **)(local_1c0._0_8_ + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"    ",4);
      local_208.m_prefix = (GLchar *)0x0;
      local_208.m_name = color_variable_name;
      local_208.m_index = color_variable_index;
      glcts::operator<<((ostream *)local_1c0,&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," = ",3);
      if (color_type == (GLchar *)0x0) {
        std::ios::clear(iVar2 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18));
      }
      else {
        sVar3 = strlen(color_type);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,color_type,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c0,"(component_0.r, ",0x10);
      lVar4 = 0xf;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"component_1.g, ",0xf)
      ;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"component_2.b, ",0xf)
      ;
      pcVar5 = "component_3.a);";
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"    ",4);
      local_208.m_prefix = (GLchar *)0x0;
      local_208.m_name = color_variable_name;
      local_208.m_index = color_variable_index;
      glcts::operator<<((ostream *)local_1c0,&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," = ",3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"textureGather",0xd);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"(",1);
      if (sampler_name_p == (GLchar *)0x0) {
        std::ios::clear(iVar2 + (int)*(_func_int **)(local_1c0._0_8_ + -0x18));
      }
      else {
        sVar3 = strlen(sampler_name_p);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1c0,sampler_name_p,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
      local_208.m_name = "texture_coordinates";
      local_208.m_prefix = attribute_name_prefix;
      local_208.m_index = attribute_index;
      glcts::operator<<((ostream *)local_1c0,&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,", ",2);
      local_1e8.m_name = "refZ";
      local_1e8.m_prefix = attribute_name_prefix;
      local_1e8.m_index = attribute_index;
      glcts::operator<<((ostream *)local_1c0,&local_1e8);
      lVar4 = 4;
      pcVar5 = ").x;";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,pcVar5,lVar4);
    std::ios::widen((char)*(_func_int **)(local_1c0._0_8_ + -0x18) + cVar1);
    break;
  default:
    goto switchD_00d68469_default;
  }
  std::ostream::put((char)local_1c0);
  std::ostream::flush();
switchD_00d68469_default:
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)out_code,(string *)&local_208);
  if ((GLchar **)local_208.m_prefix != &local_208.m_index) {
    operator_delete(local_208.m_prefix,(ulong)(local_208.m_index + 1));
  }
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x70));
  return;
}

Assistant:

void TextureCubeMapArraySamplingTest::getShadowSamplingFunctionCall(
	samplingFunction sampling_function, const glw::GLchar* color_type, glw::GLuint n_components,
	const glw::GLchar* attribute_name_prefix, const glw::GLchar* attribute_index,
	const glw::GLchar* color_variable_name, const glw::GLchar* color_variable_index, const glw::GLchar* sampler_name_p,
	std::string& out_code)
{
	std::stringstream stream;

	switch (sampling_function)
	{
	case Texture:
		/* fs_in_color = texture(sampler, vs_out_texture_coordinates); */
		stream << "    " << var2str(0, color_variable_name, color_variable_index);

		stream << " = " << texture_func << "(" << sampler_name_p;

		stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

		stream << ");" << std::endl;
		break;
	case TextureLod:
		/* fs_in_color = textureLod(sampler, vs_out_texture_coordinates, lod); */
		stream << "    " << var2str(0, color_variable_name, color_variable_index);

		stream << " = " << textureLod_func << "(" << sampler_name_p;

		stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_lod, attribute_index) << ", "
			   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

		stream << ");" << std::endl;
		break;
	case TextureGrad:
		/* fs_in_color = textureGrad(sampler, vs_out_texture_coordinates, vs_out_grad_x, vs_out_grad_y); */
		throw tcu::NotSupportedError("textureGrad operation is not available for samplerCubeArrayShadow", "", __FILE__,
									 __LINE__);
		break;
	case TextureGather:
		if (4 == n_components)
		{
			/**
			 *  color_type component_0 = textureGather(sampler, vs_out_texture_coordinates, 0);
			 *  color_type component_1 = textureGather(sampler, vs_out_texture_coordinates, 1);
			 *  color_type component_2 = textureGather(sampler, vs_out_texture_coordinates, 2);
			 *  color_type component_3 = textureGather(sampler, vs_out_texture_coordinates, 3);
			 *  fs_in_color = color_type(component_0.r, component_1.g, component_2.b, component_3.a);
			 **/
			for (glw::GLuint i = 0; i < 4; ++i)
			{
				stream << "    " << color_type << "component_" << i;

				stream << " = " << textureGather_func << "(" << sampler_name_p;

				stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
					   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

				stream << ");" << std::endl;
			}

			stream << "    " << var2str(0, color_variable_name, color_variable_index);

			stream << " = " << color_type << "(component_0.r, "
				   << "component_1.g, "
				   << "component_2.b, "
				   << "component_3.a);" << std::endl;
		}
		else
		{
			stream << "    " << var2str(0, color_variable_name, color_variable_index);

			stream << " = " << textureGather_func << "(" << sampler_name_p;

			stream << ", " << var2str(attribute_name_prefix, attribute_texture_coordinate, attribute_index) << ", "
				   << var2str(attribute_name_prefix, attribute_refZ, attribute_index);

			stream << ").x;" << std::endl;
		}
		break;
	}

	out_code = stream.str();
}